

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall leveldb::Version::LevelFileNumIterator::Prev(LevelFileNumIterator *this)

{
  int iVar1;
  uint32_t uVar2;
  
  iVar1 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((char)iVar1 != '\0') {
    if (this->index_ == 0) {
      uVar2 = (uint32_t)
              ((ulong)((long)(this->flist_->
                             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->flist_->
                            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            )._M_impl.super__Vector_impl_data._M_start) >> 3);
    }
    else {
      uVar2 = this->index_ - 1;
    }
    this->index_ = uVar2;
    return;
  }
  __assert_fail("Valid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                ,0xb6,"virtual void leveldb::Version::LevelFileNumIterator::Prev()");
}

Assistant:

void Prev() override {
    assert(Valid());
    if (index_ == 0) {
      index_ = flist_->size();  // Marks as invalid
    } else {
      index_--;
    }
  }